

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

base_learner * bfgs_setup(options_i *options,vw *all)

{
  bool *location;
  element_type *peVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  typed_option<int> *op;
  typed_option<float> *op_00;
  typed_option<unsigned_long> *ptVar4;
  element_type eVar5;
  ostream *poVar6;
  learner<bfgs,_example> *plVar7;
  vw_exception *this;
  uint32_t *puVar8;
  code *predict;
  char *pcVar9;
  code *learn;
  allocator local_354;
  allocator local_353;
  bool bfgs_option;
  bool conjugate_gradient;
  free_ptr<bfgs> b;
  allocator local_340 [32];
  option_group_definition bfgs_inner_options;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  stringstream __msg;
  undefined1 local_1d8 [96];
  bool local_178;
  option_group_definition bfgs_outer_options;
  
  scoped_calloc_or_throw<bfgs>();
  conjugate_gradient = false;
  bfgs_option = false;
  std::__cxx11::string::string
            ((string *)&local_228,"LBFGS and Conjugate Gradient options",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&bfgs_outer_options,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::string((string *)&local_248,"conjugate_gradient",local_340);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)&__msg,&local_248,&conjugate_gradient);
  local_178 = true;
  std::__cxx11::string::string
            ((string *)&bfgs_inner_options,"use conjugate gradient based optimization",&local_354);
  std::__cxx11::string::_M_assign((string *)(local_1d8 + 0x20));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&bfgs_outer_options,(typed_option<bool> *)&__msg);
  std::__cxx11::string::~string((string *)&bfgs_inner_options);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&__msg);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::string
            ((string *)&local_268,"LBFGS and Conjugate Gradient options",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&bfgs_inner_options,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::string((string *)&local_288,"bfgs",&local_354);
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)&__msg,&local_288,&bfgs_option)
  ;
  local_178 = true;
  std::__cxx11::string::string
            ((string *)local_340,"use conjugate gradient based optimization",&local_353);
  std::__cxx11::string::_M_assign((string *)(local_1d8 + 0x20));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&bfgs_inner_options,(typed_option<bool> *)&__msg);
  std::__cxx11::string::~string((string *)local_340);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&__msg);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::string::string((string *)&local_2a8,"hessian_on",&local_354);
  location = &all->hessian_on;
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)&__msg,&local_2a8,location);
  std::__cxx11::string::string
            ((string *)local_340,"use second derivative in line search",&local_353);
  std::__cxx11::string::_M_assign((string *)(local_1d8 + 0x20));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (&bfgs_inner_options,(typed_option<bool> *)&__msg);
  std::__cxx11::string::~string((string *)local_340);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)&__msg);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::string((string *)&local_2c8,"mem",&local_354);
  VW::config::typed_option<int>::typed_option
            ((typed_option<int> *)&__msg,&local_2c8,
             &(b._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bfgs_*,_false>
              ._M_head_impl)->m);
  op = VW::config::typed_option<int>::default_value((typed_option<int> *)&__msg,0xf);
  std::__cxx11::string::string((string *)local_340,"memory in bfgs",&local_353);
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>(&bfgs_inner_options,op);
  std::__cxx11::string::~string((string *)local_340);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)&__msg);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::string((string *)&local_2e8,"termination",&local_354);
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)&__msg,&local_2e8,
             &(b._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bfgs_*,_false>
              ._M_head_impl)->rel_threshold);
  op_00 = VW::config::typed_option<float>::default_value((typed_option<float> *)&__msg,0.001);
  std::__cxx11::string::string((string *)local_340,"Termination threshold",&local_353);
  std::__cxx11::string::_M_assign((string *)&(op_00->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (&bfgs_inner_options,op_00);
  std::__cxx11::string::~string((string *)local_340);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)&__msg);
  std::__cxx11::string::~string((string *)&local_2e8);
  (**options->_vptr_options_i)(options,&bfgs_outer_options);
  if (conjugate_gradient == false) {
    (**options->_vptr_options_i)(options,&bfgs_inner_options);
    if (bfgs_option == false) {
      plVar7 = (learner<bfgs,_example> *)0x0;
      goto LAB_00189d06;
    }
  }
  (b._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bfgs_*,_false>.
  _M_head_impl)->all = all;
  (b._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bfgs_*,_false>.
  _M_head_impl)->wolfe1_bound = 0.01;
  (b._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bfgs_*,_false>.
  _M_head_impl)->first_hessian_on = true;
  (b._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bfgs_*,_false>.
  _M_head_impl)->backstep_on = false;
  (b._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bfgs_*,_false>.
  _M_head_impl)->first_pass = true;
  (b._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bfgs_*,_false>.
  _M_head_impl)->gradient_pass = true;
  (b._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bfgs_*,_false>.
  _M_head_impl)->preconditioner_pass = true;
  (b._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bfgs_*,_false>.
  _M_head_impl)->final_pass = all->numpasses;
  (b._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bfgs_*,_false>.
  _M_head_impl)->no_win_counter = 0;
  if (all->holdout_set_off == false) {
    all->sd->holdout_best_loss = 3.4028234663852886e+38;
    std::__cxx11::string::string((string *)&__msg,"early_terminate",local_340);
    ptVar4 = VW::config::options_i::get_typed_option<unsigned_long>(options,(string *)&__msg);
    peVar1 = (ptVar4->m_value).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      eVar5 = 0;
    }
    else {
      eVar5 = *peVar1;
    }
    (b._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bfgs_*,_false>.
    _M_head_impl)->early_stop_thres = eVar5;
    std::__cxx11::string::~string((string *)&__msg);
  }
  if ((b._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bfgs_*,_false>.
      _M_head_impl)->m == 0) {
    *location = true;
  }
  if (all->quiet == false) {
    pcVar9 = "enabling conjugate gradient optimization via BFGS ";
    if (0 < (b._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
             super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.super__Head_base<0UL,_bfgs_*,_false>.
            _M_head_impl)->m) {
      pcVar9 = "enabling BFGS based optimization ";
    }
    std::operator<<(&((b._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
                       super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.
                       super__Head_base<0UL,_bfgs_*,_false>._M_head_impl)->all->trace_message).
                     super_ostream,pcVar9);
    pcVar9 = "**without** curvature calculation";
    if (*location != false) {
      pcVar9 = "with curvature calculation";
    }
    poVar6 = std::operator<<(&((b._M_t.super___uniq_ptr_impl<bfgs,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_bfgs_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_bfgs_*,_false>._M_head_impl)->all->
                              trace_message).super_ostream,pcVar9);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  if ((all->numpasses < 2) && (all->training == true)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
    std::operator<<((ostream *)local_1d8,"you must make at least 2 passes to use BFGS");
    this = (vw_exception *)__cxa_allocate_exception(0x38);
    std::__cxx11::stringbuf::str();
    VW::vw_exception::vw_exception
              (this,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/bfgs.cc"
               ,0x47d,&local_208);
    __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  all->bfgs = true;
  parameters::stride_shift(&all->weights,2);
  learn = learn<false>;
  if (all->audit != false) {
    learn = learn<true>;
  }
  predict = predict<false>;
  if (((all->audit | all->hash_inv) & 1U) != 0) {
    predict = predict<true>;
  }
  puVar8 = &(all->weights).dense_weights._stride_shift;
  if ((all->weights).sparse != false) {
    puVar8 = &(all->weights).sparse_weights._stride_shift;
  }
  plVar7 = LEARNER::init_learner<bfgs,example,LEARNER::learner<char,char>>
                     (&b,learn,predict,(ulong)(uint)(1 << ((byte)*puVar8 & 0x1f)));
  *(code **)(plVar7 + 0x80) = save_load;
  uVar2 = *(undefined8 *)(plVar7 + 0x18);
  uVar3 = *(undefined8 *)(plVar7 + 0x20);
  *(undefined8 *)(plVar7 + 0x70) = uVar2;
  *(undefined8 *)(plVar7 + 0x78) = uVar3;
  *(undefined8 *)plVar7 = uVar2;
  *(undefined8 *)(plVar7 + 8) = uVar3;
  *(code **)(plVar7 + 0x10) = init_driver;
  *(undefined8 *)(plVar7 + 0x88) = uVar2;
  *(undefined8 *)(plVar7 + 0x90) = uVar3;
  *(code **)(plVar7 + 0x98) = end_pass;
  *(undefined8 *)(plVar7 + 0xb8) = uVar2;
  *(undefined8 *)(plVar7 + 0xc0) = uVar3;
  *(code **)(plVar7 + 200) = finish;
LAB_00189d06:
  VW::config::option_group_definition::~option_group_definition(&bfgs_inner_options);
  VW::config::option_group_definition::~option_group_definition(&bfgs_outer_options);
  std::unique_ptr<bfgs,_void_(*)(void_*)>::~unique_ptr(&b);
  return (base_learner *)plVar7;
}

Assistant:

base_learner* bfgs_setup(options_i& options, vw& all)
{
  auto b = scoped_calloc_or_throw<bfgs>();
  bool conjugate_gradient = false;
  bool bfgs_option = false;
  option_group_definition bfgs_outer_options("LBFGS and Conjugate Gradient options");
  bfgs_outer_options.add(
      make_option("conjugate_gradient", conjugate_gradient).keep().help("use conjugate gradient based optimization"));

  option_group_definition bfgs_inner_options("LBFGS and Conjugate Gradient options");
  bfgs_inner_options.add(make_option("bfgs", bfgs_option).keep().help("use conjugate gradient based optimization"));
  bfgs_inner_options.add(make_option("hessian_on", all.hessian_on).help("use second derivative in line search"));
  bfgs_inner_options.add(make_option("mem", b->m).default_value(15).help("memory in bfgs"));
  bfgs_inner_options.add(
      make_option("termination", b->rel_threshold).default_value(0.001f).help("Termination threshold"));

  options.add_and_parse(bfgs_outer_options);
  if (!conjugate_gradient)
  {
    options.add_and_parse(bfgs_inner_options);
    if (!bfgs_option)
    {
      return nullptr;
    }
  }

  b->all = &all;
  b->wolfe1_bound = 0.01;
  b->first_hessian_on = true;
  b->first_pass = true;
  b->gradient_pass = true;
  b->preconditioner_pass = true;
  b->backstep_on = false;
  b->final_pass = all.numpasses;
  b->no_win_counter = 0;

  if (!all.holdout_set_off)
  {
    all.sd->holdout_best_loss = FLT_MAX;
    b->early_stop_thres = options.get_typed_option<size_t>("early_terminate").value();
  }

  if (b->m == 0)
    all.hessian_on = true;

  if (!all.quiet)
  {
    if (b->m > 0)
      b->all->trace_message << "enabling BFGS based optimization ";
    else
      b->all->trace_message << "enabling conjugate gradient optimization via BFGS ";
    if (all.hessian_on)
      b->all->trace_message << "with curvature calculation" << endl;
    else
      b->all->trace_message << "**without** curvature calculation" << endl;
  }

  if (all.numpasses < 2 && all.training)
    THROW("you must make at least 2 passes to use BFGS");

  all.bfgs = true;
  all.weights.stride_shift(2);

  void (*learn_ptr)(bfgs&, base_learner&, example&) = nullptr;
  if (all.audit)
        learn_ptr = learn<true>;
  else
        learn_ptr = learn<false>;

    learner<bfgs, example>* l;
  if (all.audit || all.hash_inv)
        l = &init_learner(b, learn_ptr, predict<true>, all.weights.stride());
  else
        l = &init_learner(b, learn_ptr, predict<false>, all.weights.stride());

  l->set_save_load(save_load);
  l->set_init_driver(init_driver);
  l->set_end_pass(end_pass);
  l->set_finish(finish);

  return make_base(*l);
}